

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

void __thiscall
ConsoleListener::person_changed(ConsoleListener *this,Person *param_1,string *property,any *value)

{
  bool bVar1;
  ostream *poVar2;
  unsigned_long uVar3;
  any *value_local;
  string *property_local;
  Person *param_1_local;
  ConsoleListener *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Person\'s ");
  poVar2 = std::operator<<(poVar2,(string *)property);
  std::operator<<(poVar2," has been changed to ");
  bVar1 = std::operator==(property,"age");
  if (bVar1) {
    uVar3 = std::any_cast<unsigned_long>(value);
    std::ostream::operator<<((ostream *)&std::cout,uVar3);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void person_changed(Person&, const std::string& property, const std::any& value) override
	{
		std::cout << "Person's " << property << " has been changed to ";
		if(property == "age")
		{
			std::cout << std::any_cast<size_t>(value);
		}

		std::cout << std::endl;
	}